

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::generateResendRequest(Session *this,BeginString *beginString,MsgSeqNum *msgSeqNum)

{
  bool bVar1;
  uint uVar2;
  int begin;
  int iVar3;
  Message *__p;
  FieldMap *this_00;
  Header *header;
  signed_int value;
  signed_int value_00;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator<char> local_289;
  STRING local_288;
  FieldBase local_268;
  SEQNUM local_204;
  EndSeqNo local_200;
  SEQNUM local_19c;
  EndSeqNo local_198;
  int local_134;
  undefined1 local_130 [8];
  EndSeqNo endSeqNo;
  undefined1 local_c8 [8];
  BeginSeqNo beginSeqNo;
  Message *resendRequest;
  allocator<char> local_49;
  string local_48;
  unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> local_28;
  unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> pMsg;
  MsgSeqNum *msgSeqNum_local;
  BeginString *beginString_local;
  Session *this_local;
  
  pMsg._M_t.super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>._M_t.
  super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
  super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl =
       (__uniq_ptr_data<FIX::Message,_std::default_delete<FIX::Message>,_true,_true>)
       (__uniq_ptr_data<FIX::Message,_std::default_delete<FIX::Message>,_true,_true>)msgSeqNum;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"2",&local_49);
  __p = newMessage(this,&local_48);
  std::unique_ptr<FIX::Message,std::default_delete<FIX::Message>>::
  unique_ptr<std::default_delete<FIX::Message>,void>
            ((unique_ptr<FIX::Message,std::default_delete<FIX::Message>> *)&local_28,__p);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics._8_8_ =
       std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::operator*(&local_28);
  endSeqNo.super_SeqNumField.super_FieldBase.m_metrics._12_4_ = getExpectedTargetNum(this);
  BeginSeqNo::BeginSeqNo
            ((BeginSeqNo *)local_c8,
             (SEQNUM *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.field_0xc);
  local_134 = IntField::operator_cast_to_int
                        ((IntField *)
                         pMsg._M_t.
                         super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
                         super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl);
  local_134 = local_134 + -1;
  EndSeqNo::EndSeqNo((EndSeqNo *)local_130,&local_134);
  bVar1 = operator>=(&beginString->super_StringField,"FIX.4.2");
  if (bVar1) {
    local_19c = 0;
    EndSeqNo::EndSeqNo(&local_198,&local_19c);
    EndSeqNo::operator=((EndSeqNo *)local_130,&local_198);
    EndSeqNo::~EndSeqNo(&local_198);
  }
  else {
    bVar1 = operator<=(&beginString->super_StringField,"FIX.4.1");
    if (bVar1) {
      local_204 = 999999;
      EndSeqNo::EndSeqNo(&local_200,&local_204);
      EndSeqNo::operator=((EndSeqNo *)local_130,&local_200);
      EndSeqNo::~EndSeqNo(&local_200);
    }
  }
  this_00 = &Message::getHeader((Message *)
                                beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics._8_8_)->
             super_FieldMap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"2",&local_289);
  MsgType::MsgType((MsgType *)&local_268,&local_288);
  FieldMap::setField(this_00,&local_268,true);
  MsgType::~MsgType((MsgType *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  FieldMap::setField((FieldMap *)beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics._8_8_,
                     (FieldBase *)local_c8,true);
  FieldMap::setField((FieldMap *)beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics._8_8_,
                     (FieldBase *)local_130,true);
  header = Message::getHeader((Message *)
                              beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics._8_8_);
  fill(this,header);
  sendRaw(this,(Message *)beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics._8_8_,0);
  uVar2 = IntField::operator_cast_to_int((IntField *)local_c8);
  IntConvertor::convert_abi_cxx11_(&local_310,(IntConvertor *)(ulong)uVar2,value);
  std::operator+(&local_2f0,"Sent ResendRequest FROM: ",&local_310);
  std::operator+(&local_2d0,&local_2f0," TO: ");
  uVar2 = IntField::operator_cast_to_int((IntField *)local_130);
  IntConvertor::convert_abi_cxx11_(&local_330,(IntConvertor *)(ulong)uVar2,value_00);
  std::operator+(&local_2b0,&local_2d0,&local_330);
  SessionState::onEvent(&this->m_state,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  begin = IntField::operator_cast_to_int((IntField *)local_c8);
  iVar3 = IntField::operator_cast_to_int
                    ((IntField *)
                     pMsg._M_t.
                     super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>._M_t.
                     super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
                     super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl);
  SessionState::resendRange(&this->m_state,begin,iVar3 + -1);
  EndSeqNo::~EndSeqNo((EndSeqNo *)local_130);
  BeginSeqNo::~BeginSeqNo((BeginSeqNo *)local_c8);
  std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void Session::generateResendRequest( const BeginString& beginString, const MsgSeqNum& msgSeqNum )
{
  SmartPtr<Message> pMsg(newMessage("2"));
  Message & resendRequest = *pMsg;

  BeginSeqNo beginSeqNo( ( int ) getExpectedTargetNum() );
  EndSeqNo endSeqNo( msgSeqNum - 1 );
  if ( beginString >= FIX::BeginString_FIX42 )
    endSeqNo = 0;
  else if( beginString <= FIX::BeginString_FIX41 )
    endSeqNo = 999999;
  resendRequest.getHeader().setField( MsgType( "2" ) );
  resendRequest.setField( beginSeqNo );
  resendRequest.setField( endSeqNo );
  fill( resendRequest.getHeader() );
  sendRaw( resendRequest );

  m_state.onEvent( "Sent ResendRequest FROM: "
                   + IntConvertor::convert( beginSeqNo ) +
                   " TO: " + IntConvertor::convert( endSeqNo ) );

  m_state.resendRange( beginSeqNo, msgSeqNum - 1 );
}